

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathutil.c
# Opt level: O2

uint64_t expmod(uint64_t b,uint64_t x,uint64_t n)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  uint64_t res;
  
  uVar5 = 1;
  for (; x != 0; x = x >> 1) {
    if ((x & 1) != 0) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar5;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = b;
      uVar5 = __umodti3(SUB168(auVar1 * auVar3,0),SUB168(auVar1 * auVar3,8),n,0);
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = b;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = b;
    b = __umodti3(SUB168(auVar2 * auVar4,0),SUB168(auVar2 * auVar4,8),n,0);
  }
  return uVar5;
}

Assistant:

uint64_t expmod(uint64_t b, uint64_t x, uint64_t n) {
    // perform an efficient exponentiation by squaring
    uint64_t res = 1;
    while(x > 0) {
        if(x & 0x0000000000000001) {
            res = mulmod(res, b, n);
        }
        b = mulmod(b, b, n);
        x >>= 1;
    }
    return res;
}